

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O0

ReturnCode ungetstring(Global *global,char *text)

{
  ReturnCode RVar1;
  char *in_RSI;
  Global *in_RDI;
  ReturnCode ret;
  FILEINFO *file;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  
  strlen(in_RSI);
  RVar1 = getfile(in_RDI,(size_t)in_RSI,in_stack_ffffffffffffffe8,
                  (FILEINFO **)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (RVar1 == FPP_OK) {
    strcpy(in_stack_ffffffffffffffe8 + 0x34,in_RSI);
  }
  return RVar1;
}

Assistant:

ReturnCode ungetstring(struct Global *global, char *text)
{
  /*
   * Push a string back on the input stream.  This is done by treating
   * the text as if it were a macro.
   */

  FILEINFO *file;
  ReturnCode ret;
  
  ret = getfile(global, strlen(text) + 1, "", &file);
  if(!ret)
    strcpy(file->buffer, text);
  return(ret);
}